

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall QDataWidgetMapper::setCurrentIndex(QDataWidgetMapper *this,int index)

{
  QPersistentModelIndex *this_00;
  QDataWidgetMapperPrivate *this_01;
  QAbstractItemModel *pQVar1;
  pointer pWVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  QModelIndex *__return_storage_ptr__;
  WidgetMapper *e;
  pointer m;
  long in_FS_OFFSET;
  bool bVar6;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < index) {
    this_01 = *(QDataWidgetMapperPrivate **)(this + 8);
    this_00 = &this_01->rootIndex;
    bVar6 = this_01->orientation != Horizontal;
    pQVar1 = this_01->model;
    __return_storage_ptr__ = &local_58;
    if (bVar6) {
      __return_storage_ptr__ = &local_70;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,this_00);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78 + (ulong)bVar6 * 8))(pQVar1,__return_storage_ptr__);
    if (index < iVar3) {
      pQVar1 = this_01->model;
      if (this_01->orientation == Horizontal) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
        lVar4 = *(long *)pQVar1;
        iVar3 = 0;
        iVar5 = index;
      }
      else {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
        lVar4 = *(long *)pQVar1;
        iVar5 = 0;
        iVar3 = index;
      }
      (**(code **)(lVar4 + 0x60))(&local_58,pQVar1,iVar5,iVar3,&local_70);
      QPersistentModelIndex::operator=(&this_01->currentTopLeft,&local_58);
      pWVar2 = (this_01->widgetMap).
               super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (m = (this_01->widgetMap).
               super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ._M_impl.super__Vector_impl_data._M_start; m != pWVar2; m = m + 1) {
        QDataWidgetMapperPrivate::populate(this_01,m);
      }
      local_58.r = 0;
      local_58.c = 0;
      local_58.i = (quintptr)&local_70;
      local_70.r = index;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::setCurrentIndex(int index)
{
    Q_D(QDataWidgetMapper);

    if (index < 0 || index >= d->itemCount())
        return;
    d->currentTopLeft = d->orientation == Qt::Horizontal
                            ? d->model->index(index, 0, d->rootIndex)
                            : d->model->index(0, index, d->rootIndex);
    d->populate();

    emit currentIndexChanged(index);
}